

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O1

_Bool al_set_shader_int_vector(char *name,int num_components,int *i,int num_elems)

{
  ALLEGRO_SHADER *pAVar1;
  _Bool _Var2;
  ALLEGRO_BITMAP *pAVar3;
  
  pAVar3 = al_get_target_bitmap();
  if ((pAVar3 != (ALLEGRO_BITMAP *)0x0) &&
     (pAVar1 = pAVar3->shader, pAVar1 != (ALLEGRO_SHADER *)0x0)) {
    _Var2 = (*pAVar1->vt->set_shader_int_vector)(pAVar1,name,num_components,i,num_elems);
    return _Var2;
  }
  return false;
}

Assistant:

bool al_set_shader_int_vector(const char *name,
   int num_components, const int *i, int num_elems)
{
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_SHADER *shader;

   if ((bmp = al_get_target_bitmap()) != NULL) {
      if ((shader = bmp->shader) != NULL) {
         return shader->vt->set_shader_int_vector(shader, name, num_components, i, num_elems);
      }
      else {
         return false;
      }
   }
   else {
      return false;
   }
}